

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ClearOpsBufferStorageTestCase::ClearOpsBufferStorageTestCase
          (ClearOpsBufferStorageTestCase *this,Functions *gl,TestContext *testContext,
          GLint page_size)

{
  GLint page_size_local;
  TestContext *testContext_local;
  Functions *gl_local;
  ClearOpsBufferStorageTestCase *this_local;
  
  BufferStorageTestCase::BufferStorageTestCase(&this->super_BufferStorageTestCase);
  (this->super_BufferStorageTestCase)._vptr_BufferStorageTestCase =
       (_func_int **)&PTR__ClearOpsBufferStorageTestCase_0323c940;
  this->m_gl = gl;
  this->m_helper_bo = 0;
  this->m_initial_data = (uchar *)0x0;
  this->m_n_pages_to_use = 0x10;
  this->m_page_size = page_size;
  this->m_sparse_bo = 0;
  this->m_sparse_bo_size_rounded = 0;
  this->m_testCtx = testContext;
  return;
}

Assistant:

ClearOpsBufferStorageTestCase::ClearOpsBufferStorageTestCase(const glw::Functions& gl, tcu::TestContext& testContext,
															 glw::GLint page_size)
	: m_gl(gl)
	, m_helper_bo(0)
	, m_initial_data(DE_NULL)
	, m_n_pages_to_use(16)
	, m_page_size(page_size)
	, m_sparse_bo(0)
	, m_sparse_bo_size_rounded(0)
	, m_testCtx(testContext)
{
	/* Left blank intentionally */
}